

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::Build(cmake *this,string *dir,string *target,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,bool clean)

{
  cmState *pcVar1;
  string *target_00;
  string *bindir;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  cmGlobalGenerator *pcVar5;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  char *local_1a0;
  char *cachedVerbose;
  undefined1 local_190 [6];
  bool verbose;
  char *local_170;
  char *cachedProjectName;
  string projName;
  string output;
  string local_120;
  auto_ptr<cmGlobalGenerator> local_100;
  auto_ptr<cmGlobalGenerator> gen;
  string local_f0;
  char *local_d0;
  char *cachedGenerator;
  undefined1 local_c0 [8];
  string cachePath;
  string local_98;
  allocator local_61;
  string local_60;
  byte local_39;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  bool clean_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *nativeOptions_local;
  string *config_local;
  string *target_local;
  string *dir_local;
  cmake *this_local;
  
  local_39 = clean;
  pvStack_38 = nativeOptions;
  nativeOptions_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)config;
  config_local = target;
  target_local = dir;
  dir_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"",&local_61);
  SetHomeDirectory(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"",(allocator *)(cachePath.field_2._M_local_buf + 0xf));
  SetHomeOutputDirectory(this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
  bVar2 = cmsys::SystemTools::FileIsDirectory(target_local);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_c0,(string *)target_local);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_c0);
    bVar2 = LoadCache(this,(string *)local_c0);
    if (bVar2) {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f0,"CMAKE_GENERATOR",(allocator *)((long)&gen.x_ + 7));
      pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gen.x_ + 7));
      local_d0 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
        this_local._4_4_ = 1;
        cachedGenerator._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_120,pcVar4,(allocator *)(output.field_2._M_local_buf + 0xf));
        pcVar5 = CreateGlobalGenerator(this,&local_120);
        cmsys::auto_ptr<cmGlobalGenerator>::auto_ptr(&local_100,pcVar5);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
        pcVar5 = cmsys::auto_ptr<cmGlobalGenerator>::get(&local_100);
        if (pcVar5 == (cmGlobalGenerator *)0x0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"");
          poVar3 = std::operator<<(poVar3,local_d0);
          std::operator<<(poVar3,"\"\n");
          this_local._4_4_ = 1;
          cachedGenerator._4_4_ = 1;
        }
        else {
          std::__cxx11::string::string((string *)(projName.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&cachedProjectName);
          pcVar1 = this->State;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_190,"CMAKE_PROJECT_NAME",
                     (allocator *)((long)&cachedVerbose + 7));
          pcVar4 = cmState::GetCacheEntryValue(pcVar1,(string *)local_190);
          std::__cxx11::string::~string((string *)local_190);
          std::allocator<char>::~allocator((allocator<char> *)((long)&cachedVerbose + 7));
          local_170 = pcVar4;
          if (pcVar4 == (char *)0x0) {
            std::operator<<((ostream *)&std::cerr,
                            "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
            this_local._4_4_ = 1;
          }
          else {
            std::__cxx11::string::operator=((string *)&cachedProjectName,pcVar4);
            cachedVerbose._6_1_ = 0;
            pcVar1 = this->State;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1c0,"CMAKE_VERBOSE_MAKEFILE",&local_1c1);
            pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_1c0);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
            local_1a0 = pcVar4;
            if (pcVar4 != (char *)0x0) {
              cachedVerbose._6_1_ = cmSystemTools::IsOn(pcVar4);
            }
            pcVar5 = cmsys::auto_ptr<cmGlobalGenerator>::operator->(&local_100);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1e8,"",&local_1e9);
            bindir = target_local;
            target_00 = config_local;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_210,"",&local_211);
            this_local._4_4_ =
                 cmGlobalGenerator::Build
                           (pcVar5,&local_1e8,bindir,(string *)&cachedProjectName,target_00,
                            (string *)((long)&projName.field_2 + 8),&local_210,
                            (string *)nativeOptions_local,(bool)(local_39 & 1),false,
                            (bool)(cachedVerbose._6_1_ & 1),0.0,OUTPUT_PASSTHROUGH,pvStack_38);
            std::__cxx11::string::~string((string *)&local_210);
            std::allocator<char>::~allocator((allocator<char> *)&local_211);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
          }
          cachedGenerator._4_4_ = 1;
          std::__cxx11::string::~string((string *)&cachedProjectName);
          std::__cxx11::string::~string((string *)(projName.field_2._M_local_buf + 8));
        }
        cmsys::auto_ptr<cmGlobalGenerator>::~auto_ptr(&local_100);
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
      this_local._4_4_ = 1;
      cachedGenerator._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_c0);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar3 = std::operator<<(poVar3,(string *)target_local);
    std::operator<<(poVar3," is not a directory\n");
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int cmake::Build(const std::string& dir,
                 const std::string& target,
                 const std::string& config,
                 const std::vector<std::string>& nativeOptions,
                 bool clean)
{

  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if(!cmSystemTools::FileIsDirectory(dir))
    {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
    }
  std::string cachePath = dir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  if(!this->LoadCache(cachePath))
    {
    std::cerr << "Error: could not load cache\n";
    return 1;
    }
  const char* cachedGenerator =
      this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if(!cachedGenerator)
    {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
    }
  cmsys::auto_ptr<cmGlobalGenerator> gen(
    this->CreateGlobalGenerator(cachedGenerator));
  if(!gen.get())
    {
    std::cerr << "Error: could create CMAKE_GENERATOR \""
              << cachedGenerator << "\"\n";
    return 1;
    }
  std::string output;
  std::string projName;
  const char* cachedProjectName =
      this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if(!cachedProjectName)
    {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
    }
  projName = cachedProjectName;
  bool verbose = false;
  const char* cachedVerbose =
      this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE");
  if(cachedVerbose)
    {
    verbose = cmSystemTools::IsOn(cachedVerbose);
    }
  return gen->Build("", dir,
                    projName, target,
                    output,
                    "",
                    config, clean, false, verbose, 0,
                    cmSystemTools::OUTPUT_PASSTHROUGH,
                    nativeOptions);
}